

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O1

Gia_Man_t * Gia_ManVerifyCexAndMove(Gia_Man_t *pGia,Abc_Cex_t *p)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  Gia_Man_t *pGVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  
  Gia_ManCleanMark0(pGia);
  iVar12 = pGia->nRegs;
  if (iVar12 < 1) {
    uVar11 = 0;
  }
  else {
    uVar15 = 0;
    do {
      iVar6 = pGia->vCis->nSize;
      uVar13 = (iVar6 - iVar12) + uVar15;
      if (((int)uVar13 < 0) || (iVar6 <= (int)uVar13)) goto LAB_00580760;
      iVar12 = pGia->vCis->pArray[uVar13];
      lVar7 = (long)iVar12;
      if ((lVar7 < 0) || (pGia->nObjs <= iVar12)) goto LAB_00580741;
      pGVar4 = pGia->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) {
        uVar11 = (ulong)uVar15;
        break;
      }
      uVar13 = uVar15 + 1;
      uVar11 = (ulong)uVar13;
      *(ulong *)(pGVar4 + lVar7) =
           *(ulong *)(pGVar4 + lVar7) & 0xffffffffbfffffff |
           (ulong)(((uint)(&p[1].iPo)[uVar15 >> 5] >> ((byte)uVar15 & 0x1f) & 1) << 0x1e);
      iVar12 = pGia->nRegs;
      uVar15 = uVar13;
    } while ((int)uVar13 < iVar12);
  }
  iVar12 = (int)uVar11;
  if (-1 < p->iFrame) {
    iVar6 = 0;
    do {
      pVVar10 = pGia->vCis;
      uVar16 = (ulong)(uint)pVVar10->nSize;
      if (pGia->nRegs < pVVar10->nSize) {
        lVar7 = 0;
        do {
          if ((int)uVar16 <= lVar7) goto LAB_00580760;
          lVar17 = (long)pVVar10->pArray[lVar7];
          if ((lVar17 < 0) || (pGia->nObjs <= pVVar10->pArray[lVar7])) goto LAB_00580741;
          pGVar4 = pGia->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          *(ulong *)(pGVar4 + lVar17) =
               *(ulong *)(pGVar4 + lVar17) & 0xffffffffbfffffff |
               (ulong)(((uint)(&p[1].iPo)[(int)(uVar11 + lVar7) >> 5] >>
                        ((byte)(uVar11 + lVar7) & 0x1f) & 1) << 0x1e);
          lVar7 = lVar7 + 1;
          pVVar10 = pGia->vCis;
          uVar16 = (ulong)pVVar10->nSize;
        } while (lVar7 < (long)(uVar16 - (long)pGia->nRegs));
        uVar11 = (ulong)(uint)((int)uVar11 + (int)lVar7);
      }
      iVar12 = (int)uVar11;
      if (0 < pGia->nObjs) {
        lVar7 = 0;
        lVar17 = 0;
        do {
          pGVar4 = pGia->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar16 = *(ulong *)(&pGVar4->field_0x0 + lVar7);
          if ((uVar16 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar16) {
            *(ulong *)(&pGVar4->field_0x0 + lVar7) =
                 uVar16 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar16 >> 0x3d) ^
                          *(uint *)((long)pGVar4 +
                                   (ulong)((uint)(uVar16 >> 0x1e) & 0x7ffffffc) * -3 + lVar7) >>
                          0x1e) & ((uint)(uVar16 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar4 +
                                           (ulong)(uint)((int)(uVar16 & 0x1fffffff) << 2) * -3 +
                                           lVar7) >> 0x1e) & 1) << 0x1e);
          }
          lVar17 = lVar17 + 1;
          lVar7 = lVar7 + 0xc;
        } while (lVar17 < pGia->nObjs);
      }
      pVVar10 = pGia->vCos;
      if (0 < pVVar10->nSize) {
        lVar7 = 0;
        do {
          iVar14 = pVVar10->pArray[lVar7];
          if (((long)iVar14 < 0) || (pGia->nObjs <= iVar14)) goto LAB_00580741;
          if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = pGia->pObjs + iVar14;
          uVar15 = (uint)*(ulong *)pGVar4;
          *(ulong *)pGVar4 =
               *(ulong *)pGVar4 & 0xffffffffbfffffff |
               (ulong)((uVar15 * 2 ^ *(uint *)(pGVar4 + -(ulong)(uVar15 & 0x1fffffff))) & 0x40000000
                      );
          lVar7 = lVar7 + 1;
          pVVar10 = pGia->vCos;
        } while (lVar7 < pVVar10->nSize);
      }
      if (iVar6 == p->iFrame) break;
      iVar14 = pGia->nRegs;
      if (0 < iVar14) {
        iVar9 = 0;
        do {
          iVar2 = pGia->vCos->nSize;
          uVar15 = (iVar2 - iVar14) + iVar9;
          if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) goto LAB_00580760;
          iVar2 = pGia->vCos->pArray[uVar15];
          if (((long)iVar2 < 0) || (pGia->nObjs <= iVar2)) goto LAB_00580741;
          pGVar4 = pGia->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          iVar3 = pGia->vCis->nSize;
          uVar15 = (iVar3 - iVar14) + iVar9;
          if (((int)uVar15 < 0) || (iVar3 <= (int)uVar15)) goto LAB_00580760;
          iVar14 = pGia->vCis->pArray[uVar15];
          lVar7 = (long)iVar14;
          if ((lVar7 < 0) || (pGia->nObjs <= iVar14)) goto LAB_00580741;
          *(ulong *)(pGVar4 + lVar7) =
               *(ulong *)(pGVar4 + lVar7) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar4 + iVar2) & 0x40000000);
          iVar9 = iVar9 + 1;
          iVar14 = pGia->nRegs;
        } while (iVar9 < iVar14);
      }
      bVar5 = iVar6 < p->iFrame;
      iVar6 = iVar6 + 1;
    } while (bVar5);
  }
  if (iVar12 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                  ,0x84,"Gia_Man_t *Gia_ManVerifyCexAndMove(Gia_Man_t *, Abc_Cex_t *)");
  }
  uVar15 = p->iPo;
  iVar12 = pGia->vCos->nSize;
  if (iVar12 - pGia->nRegs <= (int)uVar15) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (((int)uVar15 < 0) || (iVar12 <= (int)uVar15)) {
LAB_00580760:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar12 = pGia->vCos->pArray[uVar15];
  if (((long)iVar12 < 0) || (pGia->nObjs <= iVar12)) {
LAB_00580741:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if ((pGia->pObjs[iVar12].field_0x3 & 0x40) == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                  ,0x86,"Gia_Man_t *Gia_ManVerifyCexAndMove(Gia_Man_t *, Abc_Cex_t *)");
  }
  pVVar10 = pGia->vCis;
  uVar11 = (ulong)(uint)pVVar10->nSize;
  if (pGia->nRegs < pVVar10->nSize) {
    lVar7 = 0;
    do {
      if ((int)uVar11 <= lVar7) goto LAB_00580760;
      iVar12 = pVVar10->pArray[lVar7];
      if (((long)iVar12 < 0) || (pGia->nObjs <= iVar12)) goto LAB_00580741;
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &pGia->pObjs[iVar12].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      lVar7 = lVar7 + 1;
      pVVar10 = pGia->vCis;
      uVar11 = (ulong)pVVar10->nSize;
    } while (lVar7 < (long)(uVar11 - (long)pGia->nRegs));
  }
  pVVar10 = pGia->vCos;
  uVar11 = (ulong)(uint)pVVar10->nSize;
  if (pGia->nRegs < pVVar10->nSize) {
    lVar7 = 0;
    do {
      if ((int)uVar11 <= lVar7) goto LAB_00580760;
      iVar12 = pVVar10->pArray[lVar7];
      if (((long)iVar12 < 0) || (pGia->nObjs <= iVar12)) goto LAB_00580741;
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &pGia->pObjs[iVar12].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      lVar7 = lVar7 + 1;
      pVVar10 = pGia->vCos;
      uVar11 = (ulong)pVVar10->nSize;
    } while (lVar7 < (long)(uVar11 - (long)pGia->nRegs));
  }
  iVar12 = pGia->nRegs;
  if (0 < iVar12) {
    iVar6 = 0;
    do {
      iVar14 = pGia->vCos->nSize;
      uVar15 = (iVar14 - iVar12) + iVar6;
      if (((int)uVar15 < 0) || (iVar14 <= (int)uVar15)) goto LAB_00580760;
      iVar14 = pGia->vCos->pArray[uVar15];
      if (((long)iVar14 < 0) || (pGia->nObjs <= iVar14)) goto LAB_00580741;
      pGVar4 = pGia->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      iVar9 = pGia->vCis->nSize;
      uVar15 = (iVar9 - iVar12) + iVar6;
      if (((int)uVar15 < 0) || (iVar9 <= (int)uVar15)) goto LAB_00580760;
      iVar12 = pGia->vCis->pArray[uVar15];
      if (((long)iVar12 < 0) || (pGia->nObjs <= iVar12)) goto LAB_00580741;
      *(ulong *)(pGVar4 + iVar14) =
           *(ulong *)(pGVar4 + iVar14) & 0xffffffffbfffffff |
           (ulong)((uint)*(undefined8 *)(pGVar4 + iVar12) & 0x40000000);
      iVar6 = iVar6 + 1;
      iVar12 = pGia->nRegs;
    } while (iVar6 < iVar12);
  }
  pGVar8 = Gia_ManDupWithInit(pGia);
  Gia_ManCleanMark0(pGia);
  return pGVar8;
}

Assistant:

Gia_Man_t * Gia_ManVerifyCexAndMove( Gia_Man_t * pGia, Abc_Cex_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    Gia_ManCleanMark0(pGia);
    Gia_ManForEachRo( pGia, pObj, i )
        pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pGia, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pGia, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pGia, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( iBit == p->nBits );
    RetValue = Gia_ManPo(pGia, p->iPo)->fMark0;
    assert( RetValue );
    // set PI/PO values to zero and transfer RO values to RI
    Gia_ManForEachPi( pGia, pObj, k )
        pObj->fMark0 = 0;
    Gia_ManForEachPo( pGia, pObj, k )
        pObj->fMark0 = 0;
    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, k )
        pObjRi->fMark0 = pObjRo->fMark0;
    // duplicate assuming CI/CO marks are set correctly
    pNew = Gia_ManDupWithInit( pGia );
    Gia_ManCleanMark0(pGia);
    return pNew;
}